

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::mouseReleaseEvent(QGroupBox *this,QMouseEvent *event)

{
  long lVar1;
  QGroupBoxPrivate *this_00;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QRect local_d0;
  QPoint local_c0;
  QStyleOptionGroupBox box;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(event + 0x40) == 1) &&
     (this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8,
     this_00->overCheckBox != false)) {
    memset(&box,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox(&box);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&box);
    pQVar3 = QWidget::style(&this->super_QWidget);
    local_d0 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
    local_c0 = QPointF::toPoint((QPointF *)&local_d0);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,7,&box,&local_c0,this);
    this_00->pressedControl = SC_None;
    this_00->overCheckBox = false;
    if (iVar2 - 1U < 2 && this_00->checkable == true) {
      QGroupBoxPrivate::click(this_00);
    }
    else if (this_00->checkable != false) {
      pQVar3 = QWidget::style(&this->super_QWidget);
      local_d0 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,7,&box,1,this);
      QWidget::update(&this->super_QWidget,&local_d0);
    }
    QStyleOptionGroupBox::~QStyleOptionGroupBox(&box);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    if (!d->overCheckBox) {
        event->ignore();
        return;
    }
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl released = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                 event->position().toPoint(), this);
    bool toggle = d->checkable && (released == QStyle::SC_GroupBoxLabel
                                   || released == QStyle::SC_GroupBoxCheckBox);
    d->pressedControl = QStyle::SC_None;
    d->overCheckBox = false;
    if (toggle)
        d->click();
    else if (d->checkable)
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
}